

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

void ncnn_option_set_use_vulkan_compute(ncnn_option_t opt,int use_vulkan_compute)

{
  int use_vulkan_compute_local;
  ncnn_option_t opt_local;
  
  return;
}

Assistant:

void ncnn_option_set_use_vulkan_compute(ncnn_option_t opt, int use_vulkan_compute)
{
#if NCNN_VULKAN
    ((Option*)opt)->use_vulkan_compute = use_vulkan_compute;
#else
    (void)opt;
    (void)use_vulkan_compute;
#endif
}